

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_DCtx_setFormat(ZSTD_DCtx *dctx,ZSTD_format_e format)

{
  size_t sVar1;
  ZSTD_format_e format_local;
  ZSTD_DCtx *dctx_local;
  
  sVar1 = ZSTD_DCtx_setParameter(dctx,ZSTD_d_experimentalParam1,format);
  return sVar1;
}

Assistant:

size_t ZSTD_DCtx_setFormat(ZSTD_DCtx* dctx, ZSTD_format_e format)
{
    return ZSTD_DCtx_setParameter(dctx, ZSTD_d_format, (int)format);
}